

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void dropColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  sqlite3 *db;
  sqlite3_xauth p_Var2;
  int iVar3;
  i64 iVar4;
  uchar *zSql;
  i64 iVar5;
  RenameToken *pRVar6;
  RenameToken *pRVar7;
  char *pcVar8;
  uchar *puVar9;
  long in_FS_OFFSET;
  Parse sParse;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  iVar4 = sqlite3VdbeIntValue(*argv);
  zSql = sqlite3_value_text(argv[1]);
  iVar5 = sqlite3VdbeIntValue(argv[2]);
  pcVar8 = db->aDb[(int)iVar4].zDbSName;
  memset(&sParse,0xaa,0x1a8);
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  iVar3 = renameParseSql(&sParse,pcVar8,db,(char *)zSql,(uint)((int)iVar4 == 1));
  if (iVar3 == 0) {
    if ((sParse.pNewTable == (Table *)0x0) ||
       (iVar3 = (int)iVar5, (sParse.pNewTable)->nCol == 1 || (sParse.pNewTable)->nCol <= iVar3)) {
      iVar3 = sqlite3CorruptError(0x1d103);
    }
    else {
      pRVar6 = renameTokenFind(&sParse,(RenameCtx *)0x0,(sParse.pNewTable)->aCol[iVar3].zCnName);
      if (iVar3 < (sParse.pNewTable)->nCol + -1) {
        pRVar7 = renameTokenFind(&sParse,(RenameCtx *)0x0,
                                 (sParse.pNewTable)->aCol[(long)iVar3 + 1].zCnName);
        puVar9 = (uchar *)(pRVar7->t).z;
        pcVar8 = (pRVar6->t).z;
      }
      else {
        puVar9 = zSql + ((sParse.pNewTable)->u).tab.addColOffset;
        pcVar8 = (pRVar6->t).z;
        while ((*pcVar8 != '\0' && (*pcVar8 != ','))) {
          pcVar8 = pcVar8 + -1;
          (pRVar6->t).z = pcVar8;
        }
      }
      iVar3 = 0;
      pcVar8 = sqlite3MPrintf(db,"%.*s%s",(long)pcVar8 - (long)zSql,zSql,puVar9);
      sqlite3_result_text(context,pcVar8,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar8);
    }
  }
  renameParseCleanup(&sParse);
  db->xAuth = p_Var2;
  if (iVar3 != 0) {
    sqlite3_result_error_code(context,iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void dropColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  int iSchema = sqlite3_value_int(argv[0]);
  const char *zSql = (const char*)sqlite3_value_text(argv[1]);
  int iCol = sqlite3_value_int(argv[2]);
  const char *zDb = db->aDb[iSchema].zDbSName;
  int rc;
  Parse sParse;
  RenameToken *pCol;
  Table *pTab;
  const char *zEnd;
  char *zNew = 0;

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  rc = renameParseSql(&sParse, zDb, db, zSql, iSchema==1);
  if( rc!=SQLITE_OK ) goto drop_column_done;
  pTab = sParse.pNewTable;
  if( pTab==0 || pTab->nCol==1 || iCol>=pTab->nCol ){
    /* This can happen if the sqlite_schema table is corrupt */
    rc = SQLITE_CORRUPT_BKPT;
    goto drop_column_done;
  }

  pCol = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol].zCnName);
  if( iCol<pTab->nCol-1 ){
    RenameToken *pEnd;
    pEnd = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol+1].zCnName);
    zEnd = (const char*)pEnd->t.z;
  }else{
    assert( IsOrdinaryTable(pTab) );
    zEnd = (const char*)&zSql[pTab->u.tab.addColOffset];
    while( ALWAYS(pCol->t.z[0]!=0) && pCol->t.z[0]!=',' ) pCol->t.z--;
  }

  zNew = sqlite3MPrintf(db, "%.*s%s", pCol->t.z-zSql, zSql, zEnd);
  sqlite3_result_text(context, zNew, -1, SQLITE_TRANSIENT);
  sqlite3_free(zNew);

drop_column_done:
  renameParseCleanup(&sParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(context, rc);
  }
}